

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
          (TextureRenderer *this,int texUnit,float *texCoord,TextureType texType)

{
  RenderParams local_64;
  
  glu::TextureTestUtil::RenderParams::RenderParams(&local_64,texType);
  renderQuad(this,texUnit,texCoord,&local_64);
  return;
}

Assistant:

void TextureRenderer::renderQuad (int texUnit, const float* texCoord, TextureType texType)
{
	renderQuad(texUnit, texCoord, RenderParams(texType));
}